

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QAction*,QWidget*>::emplace_helper<QWidget*>
          (QHash<QAction_*,_QWidget_*> *this,QAction **key,QWidget **args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QAction_*,_QWidget_*> *n;
  iterator<QHashPrivate::Node<QAction_*,_QWidget_*>_> *in_RDX;
  Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QAction_*,_QWidget_*>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findOrInsert<QAction*>
            (in_RSI,(QAction **)in_RDX);
  n = QHashPrivate::iterator<QHashPrivate::Node<QAction_*,_QWidget_*>_>::node(in_RDX);
  QHashPrivate::Node<QAction*,QWidget*>::createInPlace<QWidget*>
            (n,(QAction **)in_RSI,(QWidget **)in_RDX);
  it.bucket = in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QAction_*,_QWidget_*>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }